

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O3

void __thiscall CDBWrapper::CDBWrapper(CDBWrapper *this,DBParams *params)

{
  pointer pcVar1;
  ulong uVar2;
  LevelDBContext *pLVar3;
  pointer pcVar4;
  DB *pDVar5;
  pointer puVar6;
  pointer puVar7;
  string_view source_file;
  bool bVar8;
  value_type *__val;
  _Head_base<0UL,_LevelDBContext_*,_false> __s;
  unique_ptr<LevelDBContext,_std::default_delete<LevelDBContext>_> *puVar9;
  Logger *pLVar10;
  Env *pEVar11;
  pointer puVar12;
  long lVar13;
  pointer *__ptr;
  undefined8 *puVar14;
  Options *pOVar15;
  char *pcVar16;
  long in_FS_OFFSET;
  byte bVar17;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  string_view str;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  Span<unsigned_char> bytes;
  string_view logging_function_04;
  string_view logging_function_05;
  undefined1 auVar18 [16];
  string_view logging_function_06;
  Options options;
  Status status;
  vector<unsigned_char,_std::allocator<unsigned_char>_> new_key;
  string log_msg;
  char *in_stack_fffffffffffffe60;
  Elf64_Ehdr *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  int local_168 [2];
  undefined1 local_160 [32];
  _List local_140;
  int local_138 [2];
  Cache *local_130;
  CompressionType local_110;
  FilterPolicy *local_108;
  path local_100 [2];
  DB local_98 [4];
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  bVar17 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __s._M_head_impl = (LevelDBContext *)operator_new(0x98);
  memset(__s._M_head_impl,0,0x98);
  leveldb::Options::Options(&(__s._M_head_impl)->options);
  ((__s._M_head_impl)->readoptions).verify_checksums = false;
  ((__s._M_head_impl)->readoptions).fill_cache = true;
  ((__s._M_head_impl)->readoptions).snapshot = (Snapshot *)0x0;
  ((__s._M_head_impl)->iteroptions).verify_checksums = false;
  ((__s._M_head_impl)->iteroptions).fill_cache = true;
  ((__s._M_head_impl)->iteroptions).snapshot = (Snapshot *)0x0;
  (__s._M_head_impl)->writeoptions = false;
  (__s._M_head_impl)->syncoptions = false;
  (this->m_db_context)._M_t.
  super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
  super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
  super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl = __s._M_head_impl;
  auVar18 = std::filesystem::__cxx11::path::_M_find_extension();
  if (auVar18._8_8_ == 0 ||
      auVar18._0_8_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::filesystem::__cxx11::path::path(local_100);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_58,auVar18._0_8_,0,auVar18._8_8_);
    std::filesystem::__cxx11::path::path(local_100,&local_58,auto_format);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
  }
  std::filesystem::__cxx11::path::path((path *)local_160,local_100);
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->m_name,local_160._0_8_,
             (pointer)(local_160._0_8_ +
                      CONCAT53(local_160._11_5_,CONCAT12(local_160[10],local_160._8_2_))));
  std::filesystem::__cxx11::path::~path((path *)local_160);
  std::filesystem::__cxx11::path::~path(local_100);
  (this->obfuscate_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->obfuscate_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->obfuscate_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::filesystem::__cxx11::path::path(&(this->m_path).super_path,(path *)params);
  this->m_is_memory = params->memory_only;
  puVar9 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  ((puVar9->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
   super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
   super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->penv = (Env *)0x0;
  puVar9 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  (((puVar9->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
    super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
    super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->readoptions).verify_checksums =
       true;
  puVar9 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  (((puVar9->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
    super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
    super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->iteroptions).verify_checksums =
       true;
  puVar9 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  (((puVar9->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
    super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
    super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->iteroptions).fill_cache = false;
  pcVar16 = "m_db_context";
  puVar9 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  (((puVar9->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
    super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
    super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->syncoptions).sync = true;
  uVar2 = params->cache_bytes;
  leveldb::Options::Options((Options *)local_160);
  local_130 = leveldb::NewLRUCache(uVar2 >> 1);
  local_140._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(uVar2 >> 2);
  local_108 = leveldb::NewBloomFilterPolicy(10);
  local_110 = kNoCompression;
  local_160._24_8_ = operator_new(8);
  *(undefined ***)local_160._24_8_ = &PTR__Logger_013b5908;
  local_160[10] = true;
  local_168[0] = local_138[0];
  pLVar10 = LogInstance();
  bVar8 = BCLog::Logger::WillLogCategoryLevel(pLVar10,LEVELDB,Debug);
  if (bVar8) {
    pLVar10 = LogInstance();
    bVar8 = BCLog::Logger::Enabled(pLVar10);
    if (bVar8) {
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      tinyformat::format<int,int>
                (&local_78,(tinyformat *)"LevelDB using max_open_files=%d (default=%d)\n",
                 (char *)local_138,local_168,(int *)pcVar16);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_58,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,
                        (ulong)(local_78.field_2._M_allocated_capacity + 1));
      }
      pLVar10 = LogInstance();
      local_78._M_dataplus._M_p = (pointer)0x56;
      local_78._M_string_length = 0xf96c7b;
      in_stack_fffffffffffffe60 =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
      in_stack_fffffffffffffe70 = 1;
      in_stack_fffffffffffffe68 = &CTxOut::CTxOut;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
      source_file._M_len = 0x56;
      str._M_str = local_58._M_dataplus._M_p;
      str._M_len = local_58._M_string_length;
      logging_function_06._M_str = "SetMaxOpenFiles";
      logging_function_06._M_len = 0xf;
      BCLog::Logger::LogPrintStr(pLVar10,str,logging_function_06,source_file,0x86,LEVELDB,Debug);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  puVar9 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  puVar14 = (undefined8 *)local_160;
  pOVar15 = &((puVar9->_M_t).
              super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
              super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
              super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->options;
  for (lVar13 = 0xc; lVar13 != 0; lVar13 = lVar13 + -1) {
    pOVar15->comparator = (Comparator *)*puVar14;
    puVar14 = puVar14 + (ulong)bVar17 * -2 + 1;
    pOVar15 = (Options *)((long)pOVar15 + ((ulong)bVar17 * -2 + 1) * 8);
  }
  puVar9 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  (((puVar9->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
    super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
    super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->options).create_if_missing = true;
  if (params->memory_only == true) {
    pEVar11 = leveldb::Env::Default();
    pEVar11 = leveldb::NewMemEnv(pEVar11);
    puVar9 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                       (&this->m_db_context,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                        ,0xd3,"DBContext","m_db_context");
    ((puVar9->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t
     .super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
     super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->penv = pEVar11;
    puVar9 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                       (&this->m_db_context,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                        ,0xd3,"DBContext","m_db_context");
    pEVar11 = ((puVar9->_M_t).
               super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
               super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
               super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->penv;
    puVar9 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                       (&this->m_db_context,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                        ,0xd3,"DBContext","m_db_context");
    (((puVar9->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>.
      _M_t.super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
      super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->options).env = pEVar11;
  }
  else {
    pcVar1 = local_160 + 0x10;
    if (params->wipe_data == true) {
      pcVar4 = (params->path).super_path._M_pathname._M_dataplus._M_p;
      local_160._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_160,pcVar4,
                 pcVar4 + (params->path).super_path._M_pathname._M_string_length);
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
      source_file_00._M_len = 0x56;
      logging_function._M_str = "CDBWrapper";
      logging_function._M_len = 10;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function,source_file_00,0xec,
                 IPC|I2P|VALIDATION|LEVELDB|QT|MEMPOOLREJ|PRUNE|RAND|REINDEX|SELECTCOINS|RPC|
                 WALLETDB|BENCH|TOR,(Level)(string *)local_160,in_stack_fffffffffffffe60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe68);
      if ((pointer)local_160._0_8_ != pcVar1) {
        operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
      }
      pcVar4 = (params->path).super_path._M_pathname._M_dataplus._M_p;
      local_160._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_160,pcVar4,
                 pcVar4 + (params->path).super_path._M_pathname._M_string_length);
      puVar9 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                         (&this->m_db_context,
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                          ,0xd3,"DBContext","m_db_context");
      leveldb::DestroyDB((leveldb *)&local_58,(string *)local_160,
                         &((puVar9->_M_t).
                           super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>
                           .super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->options);
      if ((pointer)local_160._0_8_ != pcVar1) {
        operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
      }
      HandleError((Status *)&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete__(local_58._M_dataplus._M_p);
      }
    }
    TryCreateDirectories(&params->path);
    pcVar4 = (params->path).super_path._M_pathname._M_dataplus._M_p;
    local_160._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_160,pcVar4,
               pcVar4 + (params->path).super_path._M_pathname._M_string_length);
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
    source_file_01._M_len = 0x56;
    logging_function_00._M_str = "CDBWrapper";
    logging_function_00._M_len = 10;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function_00,source_file_01,0xf1,
               IPC|I2P|VALIDATION|LEVELDB|QT|MEMPOOLREJ|PRUNE|RAND|REINDEX|SELECTCOINS|RPC|WALLETDB|
               ZMQ|HTTP,(Level)(string *)local_160,in_stack_fffffffffffffe60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe68);
    if ((pointer)local_160._0_8_ != pcVar1) {
      operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
    }
  }
  puVar9 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  pLVar3 = (puVar9->_M_t).
           super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
           super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
           super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl;
  pcVar4 = (params->path).super_path._M_pathname._M_dataplus._M_p;
  pcVar1 = local_160 + 0x10;
  local_160._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_160,pcVar4,
             pcVar4 + (params->path).super_path._M_pathname._M_string_length);
  puVar9 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  leveldb::DB::Open(local_98,&pLVar3->options,(string *)local_160,
                    &((puVar9->_M_t).
                      super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>
                      .super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->pdb);
  if ((pointer)local_160._0_8_ != pcVar1) {
    operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
  }
  HandleError((Status *)local_98);
  pcVar16 = "Opened LevelDB successfully\n";
  source_file_02._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
  source_file_02._M_len = 0x56;
  logging_function_01._M_str = "CDBWrapper";
  logging_function_01._M_len = 10;
  ::LogPrintf_<>(logging_function_01,source_file_02,0xf9,ALL,Info,"Opened LevelDB successfully\n");
  if ((params->options).force_compact == true) {
    pcVar4 = (params->path).super_path._M_pathname._M_dataplus._M_p;
    local_160._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_160,pcVar4,
               pcVar4 + (params->path).super_path._M_pathname._M_string_length);
    source_file_03._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
    source_file_03._M_len = 0x56;
    logging_function_02._M_str = "CDBWrapper";
    logging_function_02._M_len = 10;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function_02,source_file_03,0xfc,
               IPC|I2P|VALIDATION|LEVELDB|QT|MEMPOOLREJ|PRUNE|RAND|REINDEX|SELECTCOINS|ESTIMATEFEE|
               BENCH|HTTP|MEMPOOL,(Level)(string *)local_160,pcVar16,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe68);
    if ((pointer)local_160._0_8_ != pcVar1) {
      operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
    }
    puVar9 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                       (&this->m_db_context,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                        ,0xd3,"DBContext","m_db_context");
    pDVar5 = ((puVar9->_M_t).
              super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
              super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
              super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->pdb;
    (*pDVar5->_vptr_DB[0xb])(pDVar5,0,0);
    pcVar4 = (params->path).super_path._M_pathname._M_dataplus._M_p;
    local_160._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_160,pcVar4,
               pcVar4 + (params->path).super_path._M_pathname._M_string_length);
    source_file_04._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
    source_file_04._M_len = 0x56;
    logging_function_03._M_str = "CDBWrapper";
    logging_function_03._M_len = 10;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function_03,source_file_04,0xfe,
               IPC|I2P|VALIDATION|LEVELDB|QT|MEMPOOLREJ|PRUNE|RAND|REINDEX|SELECTCOINS|ESTIMATEFEE|
               WALLETDB,(Level)(string *)local_160,pcVar16,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe68);
    if ((pointer)local_160._0_8_ != pcVar1) {
      operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
    }
  }
  puVar12 = (pointer)operator_new(8);
  puVar12[0] = '\0';
  puVar12[1] = '\0';
  puVar12[2] = '\0';
  puVar12[3] = '\0';
  puVar12[4] = '\0';
  puVar12[5] = '\0';
  puVar12[6] = '\0';
  puVar12[7] = '\0';
  puVar6 = (this->obfuscate_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar7 = (this->obfuscate_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->obfuscate_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar12;
  (this->obfuscate_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar12 + 8;
  (this->obfuscate_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar12 + 8;
  if (puVar6 != (pointer)0x0) {
    operator_delete(puVar6,(long)puVar7 - (long)puVar6);
  }
  bVar8 = Read<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    (this,&OBFUSCATE_KEY_KEY_abi_cxx11_,&this->obfuscate_key);
  if ((!bVar8) && (params->obfuscate == true)) {
    bVar8 = IsEmpty(this);
    if (bVar8) {
      local_78._M_dataplus._M_p = (pointer)operator_new(8);
      local_78._M_string_length = (size_type)((uchar *)local_78._M_dataplus._M_p + 8);
      ((uchar *)local_78._M_dataplus._M_p)[0] = '\0';
      ((uchar *)local_78._M_dataplus._M_p)[1] = '\0';
      ((uchar *)local_78._M_dataplus._M_p)[2] = '\0';
      ((uchar *)local_78._M_dataplus._M_p)[3] = '\0';
      ((uchar *)local_78._M_dataplus._M_p)[4] = '\0';
      ((uchar *)local_78._M_dataplus._M_p)[5] = '\0';
      ((uchar *)local_78._M_dataplus._M_p)[6] = '\0';
      ((uchar *)local_78._M_dataplus._M_p)[7] = '\0';
      bytes.m_size = 8;
      bytes.m_data = (uchar *)local_78._M_dataplus._M_p;
      local_78.field_2._M_allocated_capacity = local_78._M_string_length;
      GetRandBytes(bytes);
      Write<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (this,&OBFUSCATE_KEY_KEY_abi_cxx11_,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,false);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&this->obfuscate_key,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78);
      pcVar4 = (params->path).super_path._M_pathname._M_dataplus._M_p;
      local_160._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_160,pcVar4,
                 pcVar4 + (params->path).super_path._M_pathname._M_string_length);
      puVar6 = (this->obfuscate_key).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      s.m_size = (long)(this->obfuscate_key).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar6;
      s.m_data = puVar6;
      HexStr_abi_cxx11_(&local_58,s);
      source_file_05._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
      source_file_05._M_len = 0x56;
      logging_function_04._M_str = "CDBWrapper";
      logging_function_04._M_len = 10;
      ::LogPrintf_<std::__cxx11::string,std::__cxx11::string>
                (logging_function_04,source_file_05,0x10f,
                 IPC|I2P|VALIDATION|LEVELDB|QT|MEMPOOLREJ|PRUNE|RAND|REINDEX|SELECTCOINS|ESTIMATEFEE
                 |WALLETDB|ZMQ|MEMPOOL,(Level)(string *)local_160,(char *)&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      if ((pointer)local_160._0_8_ != pcVar1) {
        operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
      }
      if ((uchar *)local_78._M_dataplus._M_p != (uchar *)0x0) {
        operator_delete(local_78._M_dataplus._M_p,
                        local_78.field_2._M_allocated_capacity - (long)local_78._M_dataplus._M_p);
      }
    }
  }
  pcVar4 = (params->path).super_path._M_pathname._M_dataplus._M_p;
  local_160._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_160,pcVar4,
             pcVar4 + (params->path).super_path._M_pathname._M_string_length);
  puVar6 = (this->obfuscate_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  s_00.m_size = (long)(this->obfuscate_key).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar6;
  s_00.m_data = puVar6;
  HexStr_abi_cxx11_(&local_58,s_00);
  source_file_06._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
  source_file_06._M_len = 0x56;
  logging_function_05._M_str = "CDBWrapper";
  logging_function_05._M_len = 10;
  ::LogPrintf_<std::__cxx11::string,std::__cxx11::string>
            (logging_function_05,source_file_06,0x112,
             IPC|I2P|VALIDATION|LEVELDB|QT|MEMPOOLREJ|PRUNE|RAND|REINDEX|SELECTCOINS|ESTIMATEFEE|RPC
             |HTTP,(Level)(string *)local_160,(char *)&local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if ((pointer)local_160._0_8_ != pcVar1) {
    operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
  }
  if (local_98[0]._vptr_DB != (_func_int **)0x0) {
    operator_delete__(local_98[0]._vptr_DB);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CDBWrapper::CDBWrapper(const DBParams& params)
    : m_db_context{std::make_unique<LevelDBContext>()}, m_name{fs::PathToString(params.path.stem())}, m_path{params.path}, m_is_memory{params.memory_only}
{
    DBContext().penv = nullptr;
    DBContext().readoptions.verify_checksums = true;
    DBContext().iteroptions.verify_checksums = true;
    DBContext().iteroptions.fill_cache = false;
    DBContext().syncoptions.sync = true;
    DBContext().options = GetOptions(params.cache_bytes);
    DBContext().options.create_if_missing = true;
    if (params.memory_only) {
        DBContext().penv = leveldb::NewMemEnv(leveldb::Env::Default());
        DBContext().options.env = DBContext().penv;
    } else {
        if (params.wipe_data) {
            LogPrintf("Wiping LevelDB in %s\n", fs::PathToString(params.path));
            leveldb::Status result = leveldb::DestroyDB(fs::PathToString(params.path), DBContext().options);
            HandleError(result);
        }
        TryCreateDirectories(params.path);
        LogPrintf("Opening LevelDB in %s\n", fs::PathToString(params.path));
    }
    // PathToString() return value is safe to pass to leveldb open function,
    // because on POSIX leveldb passes the byte string directly to ::open(), and
    // on Windows it converts from UTF-8 to UTF-16 before calling ::CreateFileW
    // (see env_posix.cc and env_windows.cc).
    leveldb::Status status = leveldb::DB::Open(DBContext().options, fs::PathToString(params.path), &DBContext().pdb);
    HandleError(status);
    LogPrintf("Opened LevelDB successfully\n");

    if (params.options.force_compact) {
        LogPrintf("Starting database compaction of %s\n", fs::PathToString(params.path));
        DBContext().pdb->CompactRange(nullptr, nullptr);
        LogPrintf("Finished database compaction of %s\n", fs::PathToString(params.path));
    }

    // The base-case obfuscation key, which is a noop.
    obfuscate_key = std::vector<unsigned char>(OBFUSCATE_KEY_NUM_BYTES, '\000');

    bool key_exists = Read(OBFUSCATE_KEY_KEY, obfuscate_key);

    if (!key_exists && params.obfuscate && IsEmpty()) {
        // Initialize non-degenerate obfuscation if it won't upset
        // existing, non-obfuscated data.
        std::vector<unsigned char> new_key = CreateObfuscateKey();

        // Write `new_key` so we don't obfuscate the key with itself
        Write(OBFUSCATE_KEY_KEY, new_key);
        obfuscate_key = new_key;

        LogPrintf("Wrote new obfuscate key for %s: %s\n", fs::PathToString(params.path), HexStr(obfuscate_key));
    }

    LogPrintf("Using obfuscation key for %s: %s\n", fs::PathToString(params.path), HexStr(obfuscate_key));
}